

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMath.c
# Opt level: O0

float deInt32ToFloatRoundToNegInf(deInt32 x)

{
  deUint32 dVar1;
  int iVar2;
  float nearestLower;
  float oneUlp;
  float nearestHigher;
  deUint32 lostMask;
  int numLostBits;
  int exponent;
  deInt32 x_local;
  
  if ((x < -0xffffff) || (0xffffff < x)) {
    if (x == -0x80000000) {
      exponent = -0x31000000;
    }
    else {
      dVar1 = deAbs32(x);
      iVar2 = deClz32(dVar1);
      dVar1 = deBitMask32(0,8 - iVar2);
      if (x < 1) {
        if ((dVar1 & -x) == 0) {
          exponent = (int)(float)x;
        }
        else {
          nearestHigher._0_1_ = (byte)(8 - iVar2);
          exponent = (int)((float)(int)-(~dVar1 & -x) -
                          (float)(uint)(1 << (nearestHigher._0_1_ & 0x1f)));
        }
      }
      else {
        exponent = (int)(float)(int)((dVar1 ^ 0xffffffff) & x);
      }
    }
  }
  else {
    exponent = (int)(float)x;
  }
  return (float)exponent;
}

Assistant:

float deInt32ToFloatRoundToNegInf (deInt32 x)
{
	/* \note Sign bit is separate so the range is symmetric */
	if (x >= -0xFFFFFF && x <= 0xFFFFFF)
	{
		/* 24 bits are representable (23 mantissa + 1 implicit). */
		return (float)x;
	}
	else if (x != -0x7FFFFFFF - 1)
	{
		/* we are losing bits */
		const int		exponent	= 31 - deClz32((deUint32)deAbs32(x));
		const int		numLostBits	= exponent - 23;
		const deUint32	lostMask	= deBitMask32(0, numLostBits);

		DE_ASSERT(numLostBits > 0);

		if (x > 0)
		{
			/* Mask out lost bits to floor to a representable value */
			return (float)(deInt32)(~lostMask & (deUint32)x);
		}
		else if ((lostMask & (deUint32)-x) == 0u)
		{
			/* this was a representable value */
			DE_ASSERT( (deInt32)(float)x == x );
			return (float)x;
		}
		else
		{
			/* not representable, choose the next lower */
			const float nearestHigher	= (float)-(deInt32)(~lostMask & (deUint32)-x);
			const float oneUlp			= (float)(1u << (deUint32)numLostBits);
			const float nearestLower	= nearestHigher - oneUlp;

			/* check sanity */
			DE_ASSERT((deInt32)(float)nearestHigher > (deInt32)(float)nearestLower);

			return nearestLower;
		}
	}
	else
		return -(float)0x80000000u;
}